

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkSStolerances(ARKodeMem ark_mem,realtype reltol,realtype abstol)

{
  double dVar1;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int local_4;
  
  dVar1 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSStolerances","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,"ARKode","arkSStolerances","Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (0.0 <= dVar1) {
      in_RDI->atolmin0 = (uint)(dVar1 == 0.0);
      in_RDI->reltol = in_XMM0_Qa;
      in_RDI->Sabstol = dVar1;
      in_RDI->itol = 0;
      in_RDI->user_efun = 0;
      in_RDI->efun = arkEwtSetSS;
      in_RDI->e_data = in_RDI;
      local_4 = 0;
    }
    else {
      arkProcessError(in_RDI,-0x16,"ARKode","arkSStolerances",
                      "abstol has negative component(s) (illegal).");
      local_4 = -0x16;
    }
  }
  else {
    arkProcessError(in_RDI,-0x16,"ARKode","arkSStolerances","reltol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkSStolerances(ARKodeMem ark_mem, realtype reltol, realtype abstol)
{
  /* Check inputs */
  if (ark_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSStolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkSStolerances", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }
  if (reltol < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSStolerances", MSG_ARK_BAD_RELTOL);
    return(ARK_ILL_INPUT);
  }
  if (abstol < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSStolerances", MSG_ARK_BAD_ABSTOL);
    return(ARK_ILL_INPUT);
  }

  /* Set flag indicating whether abstol == 0 */
  ark_mem->atolmin0 = (abstol == ZERO);

  /* Copy tolerances into memory */
  ark_mem->reltol  = reltol;
  ark_mem->Sabstol = abstol;
  ark_mem->itol    = ARK_SS;

  /* enforce use of arkEwtSetSS */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->efun      = arkEwtSetSS;
  ark_mem->e_data    = ark_mem;

  return(ARK_SUCCESS);
}